

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O3

_compilation_result __thiscall
glcts::TessellationShaderError1InputBlocks::getCompilationResult
          (TessellationShaderError1InputBlocks *this,_pipeline_stage pipeline_stage)

{
  return (_compilation_result)
         ((pipeline_stage - PIPELINE_STAGE_TESSELLATION_CONTROL & 0xfffffffd) == 0);
}

Assistant:

TessellationShaderErrorsTestCaseBase::_compilation_result TessellationShaderError1InputBlocks::getCompilationResult(
	_pipeline_stage pipeline_stage)
{
	/* Tessellation control shader is allowed to fail to compile,
	 * shaders for all other stages should compile successfully
	 *
	 * NOTE: Vertex shader compilation can fail if underlying implementation does not support
	 *       GL_EXT_shader_io_blocks.
	 **/
	switch (pipeline_stage)
	{
	case PIPELINE_STAGE_VERTEX:
		return COMPILATION_RESULT_CAN_FAIL;
	case PIPELINE_STAGE_TESSELLATION_CONTROL:
		return COMPILATION_RESULT_CAN_FAIL;
	default:
		return COMPILATION_RESULT_MUST_SUCCEED;
	}
}